

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::input_stream_t
          (input_stream_t<cfgfile::string_trait_t> *this,string_t *file_name,istream_t *input)

{
  istream_t *stream;
  pos_t pVar1;
  pos_t size;
  
  this->m_stream = input;
  this->m_line_number = 1;
  this->m_column_number = 1;
  std::
  stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>>>
  ::
  stack<std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>>,void>
            (&this->m_prev_positions);
  std::__cxx11::string::string((string *)&this->m_file_name,(string *)file_name);
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>(&this->m_returned_char);
  this->m_stream_pos = 0;
  (this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_buf_pos = 0;
  stream = this->m_stream;
  *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) =
       *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) & 0xffffefff;
  pVar1 = string_trait_t::size_of_file(stream);
  size = 0;
  if (0 < pVar1) {
    size = pVar1;
  }
  this->m_stream_size = size;
  string_trait_t::fill_buf(this->m_stream,&this->m_buf,0x200,&this->m_stream_pos,size);
  return;
}

Assistant:

input_stream_t( const typename Trait::string_t & file_name,
		typename Trait::istream_t & input )
		:	m_stream( input )
		,	m_line_number( 1 )
		,	m_column_number( 1 )
		,	m_file_name( file_name )
		,	m_buf_pos( 0 )
		,	m_stream_pos( 0 )
	{
		Trait::noskipws( m_stream );

		m_stream_size = Trait::size_of_file( m_stream );

		if( m_stream_size < 0 )
			m_stream_size = 0;

		Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
	}